

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_pop_unused(REF_NODE ref_node,REF_GLOB *new_global)

{
  int iVar1;
  long lVar2;
  REF_GLOB RVar3;
  
  iVar1 = ref_node->n_unused;
  lVar2 = (long)iVar1;
  if (lVar2 == 0) {
    RVar3 = -1;
  }
  else {
    ref_node->n_unused = iVar1 + -1;
    RVar3 = ref_node->unused_global[lVar2 + -1];
  }
  *new_global = RVar3;
  return (uint)(lVar2 == 0);
}

Assistant:

REF_FCN REF_STATUS ref_node_pop_unused(REF_NODE ref_node,
                                       REF_GLOB *new_global) {
  if (0 == ref_node_n_unused(ref_node)) {
    *new_global = REF_EMPTY;
    return REF_FAILURE;
  }

  ref_node_n_unused(ref_node)--;
  *new_global = ref_node->unused_global[ref_node_n_unused(ref_node)];

  return REF_SUCCESS;
}